

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O0

string * kaitai::kstream::process_xor_many(string *__return_storage_ptr__,string *data,string *key)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  byte *pbVar4;
  ulong local_58;
  size_t i;
  size_t ki;
  allocator local_32;
  undefined1 local_31;
  ulong local_30;
  size_t kl;
  size_t len;
  string *key_local;
  string *data_local;
  string *result;
  
  len = (size_t)key;
  key_local = data;
  data_local = __return_storage_ptr__;
  kl = std::__cxx11::string::length();
  local_30 = std::__cxx11::string::length();
  sVar3 = kl;
  local_31 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,sVar3,' ',&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  i = 0;
  for (local_58 = 0; local_58 < kl; local_58 = local_58 + 1) {
    pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)data);
    bVar1 = *pbVar4;
    pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)key);
    bVar2 = *pbVar4;
    pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pbVar4 = bVar1 ^ bVar2;
    i = i + 1;
    if (local_30 <= i) {
      i = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string kaitai::kstream::process_xor_many(std::string data, std::string key) {
    size_t len = data.length();
    size_t kl = key.length();
    std::string result(len, ' ');

    size_t ki = 0;
    for (size_t i = 0; i < len; i++) {
        result[i] = data[i] ^ key[ki];
        ki++;
        if (ki >= kl)
            ki = 0;
    }

    return result;
}